

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

wchar_t dungeon_get_next_level(player *p,wchar_t dlev,wchar_t added)

{
  _Bool _Var1;
  wchar_t local_28;
  wchar_t local_24;
  wchar_t i;
  wchar_t target_level;
  wchar_t added_local;
  wchar_t dlev_local;
  player *p_local;
  
  local_24 = dlev + added * (uint)z_info->stair_skip;
  if ((uint)z_info->max_depth + L'\xffffffff' < local_24) {
    local_24 = (uint)z_info->max_depth + L'\xffffffff';
  }
  local_28 = dlev;
  if (local_24 < L'\0') {
    local_24 = L'\0';
  }
  while( true ) {
    if (local_24 < local_28) {
      return local_24;
    }
    _Var1 = is_quest(p,local_28);
    if (_Var1) break;
    local_28 = local_28 + L'\x01';
  }
  return local_28;
}

Assistant:

int dungeon_get_next_level(struct player *p, int dlev, int added)
{
	int target_level, i;

	/* Get target level */
	target_level = dlev + added * z_info->stair_skip;

	/* Don't allow levels below max */
	if (target_level > z_info->max_depth - 1)
		target_level = z_info->max_depth - 1;

	/* Don't allow levels above the town */
	if (target_level < 0) target_level = 0;

	/* Check intermediate levels for quests */
	for (i = dlev; i <= target_level; i++) {
		if (is_quest(p, i)) return i;
	}

	return target_level;
}